

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__load_and_postprocess_8bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar *__ptr;
  uchar *puVar1;
  undefined8 *puVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  stbi__result_info ri;
  stbi__result_info local_3c;
  
  __ptr = (uchar *)stbi__load_main(s,x,y,comp,req_comp,&local_3c,8);
  if (__ptr == (uchar *)0x0) {
    __ptr = (uchar *)0x0;
  }
  else {
    if (local_3c.bits_per_channel != 8) {
      iVar4 = req_comp;
      if (req_comp == 0) {
        iVar4 = *comp;
      }
      uVar7 = *y * *x * iVar4;
      puVar1 = (uchar *)malloc((long)(int)uVar7);
      if (puVar1 == (uchar *)0x0) {
        puVar2 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
        *puVar2 = "outofmem";
        __ptr = puVar1;
      }
      else {
        if (0 < (int)uVar7) {
          uVar5 = 0;
          do {
            puVar1[uVar5] = __ptr[uVar5 * 2 + 1];
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        free(__ptr);
        __ptr = puVar1;
      }
    }
    lVar3 = __tls_get_addr(&PTR_00160d40);
    piVar6 = &stbi__vertically_flip_on_load_global;
    if (*(int *)(lVar3 + 0xc) != 0) {
      piVar6 = (int *)(lVar3 + 8);
    }
    if (*piVar6 != 0) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(__ptr,*x,*y,req_comp);
    }
  }
  return __ptr;
}

Assistant:

static unsigned char *stbi__load_and_postprocess_8bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 8);

   if (result == NULL)
      return NULL;

   // it is the responsibility of the loaders to make sure we get either 8 or 16 bit.
   STBI_ASSERT(ri.bits_per_channel == 8 || ri.bits_per_channel == 16);

   if (ri.bits_per_channel != 8) {
      result = stbi__convert_16_to_8((stbi__uint16 *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 8;
   }

   // @TODO: move stbi__convert_format to here

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi_uc));
   }

   return (unsigned char *) result;
}